

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

Sign GEO::PCK::det_3d(double *p0,double *p1,double *p2)

{
  undefined4 local_24;
  Sign result;
  double *p2_local;
  double *p1_local;
  double *p0_local;
  
  local_24 = det_3d_filter(p0,p1,p2);
  if (local_24 == ZERO) {
    local_24 = anon_unknown.dwarf_5292d::det_3d_exact(p0,p1,p2);
  }
  return local_24;
}

Assistant:

Sign det_3d(
	    const double* p0, const double* p1, const double* p2
	) {
            PCK_STAT(cnt_det3d_total++);	  
	    Sign result = Sign(
		det_3d_filter(p0, p1, p2)
	    );
	    if(result == 0) {
		result = det_3d_exact(p0, p1, p2);
	    }
	    return result;
	}